

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_multiCallNotMadeIsNotFulfilledButCanMatchActualCalls_Test::testBody
          (TEST_MockExpectedCall_multiCallNotMadeIsNotFulfilledButCanMatchActualCalls_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_c0;
  MockCheckedExpectedCall expectedCall;
  
  MockCheckedExpectedCall::MockCheckedExpectedCall(&expectedCall,2);
  SimpleString::SimpleString(&local_c0,"name");
  MockCheckedExpectedCall::withName(&expectedCall,&local_c0);
  SimpleString::~SimpleString(&local_c0);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = MockCheckedExpectedCall::isFulfilled(&expectedCall);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!expectedCall.isFulfilled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x1dd,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = MockCheckedExpectedCall::canMatchActualCalls(&expectedCall);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","expectedCall.canMatchActualCalls()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x1de,pTVar3);
  MockCheckedExpectedCall::~MockCheckedExpectedCall(&expectedCall);
  return;
}

Assistant:

TEST(MockExpectedCall, multiCallNotMadeIsNotFulfilledButCanMatchActualCalls)
{
    MockCheckedExpectedCall expectedCall(2);
    expectedCall.withName("name");
    CHECK(!expectedCall.isFulfilled());
    CHECK(expectedCall.canMatchActualCalls());
}